

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void int_linear_reif<1>(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  int in_ECX;
  undefined4 in_EDX;
  vec<IntVar_*> *in_RSI;
  LinearNE<2,_3,_1> *in_RDI;
  Branching in_R8;
  uint i;
  vec<int> b;
  BoolView *in_stack_fffffffffffffdc8;
  BoolView *in_stack_fffffffffffffdd0;
  FILE *__stream;
  BoolView *in_stack_fffffffffffffdd8;
  vec<int> *in_stack_fffffffffffffde0;
  BoolView *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  int _c;
  vec<IntVar_*> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  int _c_00;
  vec<IntVar_*> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  LinearGE<1,_1> *in_stack_fffffffffffffeb0;
  LinearGE<1,_1> *this;
  undefined1 local_59;
  uint local_38;
  uint local_34;
  BoolView *in_stack_ffffffffffffffd8;
  
  vec<int>::vec((vec<int> *)&stack0xffffffffffffffd0);
  local_34 = 0;
  while( true ) {
    uVar1 = local_34;
    uVar2 = vec<int>::size((vec<int> *)in_RDI);
    _c = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    _c_00 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (uVar2 <= uVar1) break;
    piVar3 = vec<int>::operator[]((vec<int> *)in_RDI,local_34);
    local_38 = -*piVar3;
    vec<int>::push(in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8);
    local_34 = local_34 + 1;
  }
  switch(in_EDX) {
  case 0:
    operator_new(0x88);
    local_59 = 1;
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    LinearGE<1,_1>::LinearGE
              (in_stack_fffffffffffffeb0,
               (vec<int> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,_c_00,
               (BoolView *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_59 = 0;
    BoolView::~BoolView((BoolView *)0x26321a);
    operator_new(0x88);
    in_ECX = -in_ECX;
    this = (LinearGE<1,_1> *)&stack0xffffffffffffff90;
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    LinearGE<1,_1>::LinearGE
              (this,(vec<int> *)CONCAT44(in_ECX,in_stack_fffffffffffffea8),in_RSI,_c_00,
               (BoolView *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    BoolView::~BoolView((BoolView *)0x2632b6);
    operator_new(0x58);
    operator~(in_stack_fffffffffffffdd8);
    LinearNE<2,_3,_1>::LinearNE
              (in_RDI,(vec<int> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70,_c,in_stack_fffffffffffffe60);
    BoolView::~BoolView((BoolView *)0x26335a);
    break;
  case 1:
    operator~(in_stack_fffffffffffffdd8);
    int_linear_reif<1>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),
                       (IntRelType)((ulong)in_R8._vptr_Branching >> 0x20),(int)in_R8._vptr_Branching
                       ,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x2634c5);
    break;
  case 2:
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    int_linear_reif<1>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),
                       (IntRelType)((ulong)in_R8._vptr_Branching >> 0x20),(int)in_R8._vptr_Branching
                       ,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x263565);
    break;
  case 3:
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    int_linear_reif<1>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),
                       (IntRelType)((ulong)in_R8._vptr_Branching >> 0x20),(int)in_R8._vptr_Branching
                       ,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x2635fe);
    break;
  case 4:
    operator_new(0x88);
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    LinearGE<1,_1>::LinearGE
              (in_stack_fffffffffffffeb0,
               (vec<int> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,_c_00,
               (BoolView *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    BoolView::~BoolView((BoolView *)0x2636b5);
    operator_new(0x88);
    operator~(in_stack_fffffffffffffdd8);
    LinearGE<1,_1>::LinearGE
              (in_stack_fffffffffffffeb0,
               (vec<int> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,_c_00,
               (BoolView *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    BoolView::~BoolView((BoolView *)0x26373e);
    break;
  case 5:
    BoolView::BoolView(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    int_linear_reif<1>((vec<int> *)in_RSI,(vec<IntVar_*> *)CONCAT44(in_EDX,in_ECX),
                       (IntRelType)((ulong)in_R8._vptr_Branching >> 0x20),(int)in_R8._vptr_Branching
                       ,in_stack_ffffffffffffffd8);
    BoolView::~BoolView((BoolView *)0x26383e);
    break;
  default:
    __stream = _stderr;
    pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
      ;
    }
    else {
      pcVar4 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/linear.cpp"
                       ,0x2f);
      pcVar4 = pcVar4 + 1;
    }
    fprintf(__stream,"%s:%d: ",pcVar4,0x1a1);
    fprintf(_stderr,"Assertion failed.\n");
    abort();
  }
  vec<int>::~vec((vec<int> *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void int_linear_reif(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, BoolView r) {
	vec<int> b;
	for (unsigned int i = 0; i < a.size(); i++) {
		b.push(-a[i]);
	}
	switch (t) {
		case IRT_EQ:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c, r);
			new LinearNE<2 * S, 2 * S + 1, 1>(a, x, c, ~r);
			break;
		case IRT_NE:
			int_linear_reif<S>(a, x, IRT_EQ, c, ~r);
			break;
		case IRT_LE:
			int_linear_reif<S>(b, x, IRT_GE, -c, r);
			break;
		case IRT_LT:
			int_linear_reif<S>(b, x, IRT_GE, -c + 1, r);
			break;
		case IRT_GE:
			new LinearGE<S, 1>(a, x, c, r);
			new LinearGE<S, 1>(b, x, -c + 1, ~r);
			break;
		case IRT_GT:
			int_linear_reif<S>(a, x, IRT_GE, c + 1, r);
			break;
		default:
			NEVER;
	}
}